

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O0

Bool host_poll_events(Host *host)

{
  int iVar1;
  HostKeycode HVar2;
  Bool BVar3;
  undefined8 uVar4;
  undefined1 local_58 [4];
  HostKeycode keycode;
  SDL_Event event;
  Emulator *pEStack_18;
  Bool running;
  Emulator *e;
  Host *host_local;
  
  e = (Emulator *)host;
  pEStack_18 = host_get_emulator(host);
  event._52_4_ = 1;
  while (iVar1 = SDL_PollEvent(local_58), iVar1 != 0) {
    host_ui_event(*(HostUI **)&e->cart_infos[3].cgb_flag,(SDL_Event *)local_58);
    if (local_58 == (undefined1  [4])0x100) {
      event._52_4_ = 0;
    }
    else if ((int)local_58 - 0x300U < 2) {
      HVar2 = scancode_to_keycode(event.display.display);
      BVar3 = host_ui_capture_keyboard(*(HostUI **)&e->cart_infos[3].cgb_flag);
      if (BVar3 == FALSE) {
        *(uint *)((long)&e->cart_infos[7].size + (ulong)HVar2 * 4) =
             (uint)(local_58 == (undefined1  [4])0x300);
      }
      if (local_58 == (undefined1  [4])0x300) {
        if (*(long *)&(e->config).log_apu_writes != 0) {
          (**(code **)&(e->config).log_apu_writes)(e->cart_infos + 1,HVar2);
        }
      }
      else if ((e->file_data).data != (u8 *)0x0) {
        (*(code *)(e->file_data).data)(e->cart_infos + 1,HVar2);
      }
    }
    else if (local_58 == (undefined1  [4])0x653) {
      if (*(long *)&e->cart_infos[1].ext_ram_size == 0) {
        uVar4 = SDL_GameControllerOpen(event.type);
        *(undefined8 *)&e->cart_infos[1].ext_ram_size = uVar4;
      }
    }
    else if ((local_58 == (undefined1  [4])0x654) && (*(long *)&e->cart_infos[1].ext_ram_size != 0))
    {
      SDL_GameControllerClose(*(undefined8 *)&e->cart_infos[1].ext_ram_size);
      *(undefined8 *)&e->cart_infos[1].ext_ram_size = 0;
    }
  }
  return event._52_4_;
}

Assistant:

Bool host_poll_events(Host* host) {
  Emulator* e = host_get_emulator(host);
  Bool running = TRUE;
  SDL_Event event;
  while (SDL_PollEvent(&event)) {
    host_ui_event(host->ui, &event);

    switch (event.type) {
      case SDL_KEYDOWN:
      case SDL_KEYUP: {
        HostKeycode keycode = scancode_to_keycode(event.key.keysym.scancode);
        if (!host_ui_capture_keyboard(host->ui)) {
          host->key_state[keycode] = event.type == SDL_KEYDOWN;
        }
        if (event.type == SDL_KEYDOWN) {
          HOOK(key_down, keycode);
        } else {
          HOOK(key_up, keycode);
        }
        break;
      }
      case SDL_CONTROLLERDEVICEADDED:
        if (!host->controller) {
          host->controller = SDL_GameControllerOpen(event.cdevice.which);
        }
        break;
      case SDL_CONTROLLERDEVICEREMOVED: {
        if (host->controller) {
          SDL_GameControllerClose(host->controller);
          host->controller = NULL;
        }
        break;
      }
      case SDL_QUIT:
        running = FALSE;
        break;
      default: break;
    }
  }

  return running;
}